

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O1

void mpp_writer_put_se(MppWriteCtx *ctx,RK_S32 val)

{
  RK_U32 val_00;
  
  val_00 = val * 2 - 1;
  if (val < 1) {
    val_00 = val * -2;
  }
  mpp_writer_put_ue(ctx,val_00);
  return;
}

Assistant:

void mpp_writer_put_se(MppWriteCtx *ctx, RK_S32 val)
{
    RK_U32 tmp;

    if (val > 0)
        tmp = (RK_U32)(2 * val - 1);
    else
        tmp = (RK_U32)(-2 * val);

    mpp_writer_put_ue(ctx, tmp);
}